

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O1

void __thiscall ExprTree::setOutput(ExprTree *this,VarnodeTpl *newout)

{
  OpTpl *pOVar1;
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  iterator __position;
  VarnodeTpl *pVVar2;
  LowlevelError *this_01;
  OpTpl *op;
  OpTpl *local_48;
  string local_40;
  
  pVVar2 = this->outvn;
  if (pVVar2 != (VarnodeTpl *)0x0) {
    if (pVVar2->unnamed_flag == true) {
      operator_delete(pVVar2);
      pOVar1 = (this->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
               super__Vector_impl_data._M_finish[-1];
      local_48 = pOVar1;
      if (pOVar1->output != (VarnodeTpl *)0x0) {
        operator_delete(pOVar1->output);
      }
      pOVar1->output = (VarnodeTpl *)0x0;
      local_48->output = newout;
    }
    else {
      local_48 = (OpTpl *)operator_new(0x28);
      (local_48->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_48->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_48->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48->opc = CPUI_COPY;
      local_48->output = (VarnodeTpl *)0x0;
      OpTpl::addInput(local_48,pVVar2);
      local_48->output = newout;
      this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)this->ops;
      __position._M_current = *(OpTpl ***)(this_00 + 8);
      if (__position._M_current == *(OpTpl ***)(this_00 + 0x10)) {
        std::vector<OpTpl*,std::allocator<OpTpl*>>::_M_realloc_insert<OpTpl*const&>
                  (this_00,__position,&local_48);
      }
      else {
        *__position._M_current = local_48;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    pVVar2 = (VarnodeTpl *)operator_new(0x68);
    VarnodeTpl::VarnodeTpl(pVVar2,newout);
    this->outvn = pVVar2;
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Expression has no output","")
  ;
  LowlevelError::LowlevelError(this_01,&local_40);
  __cxa_throw(this_01,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void ExprTree::setOutput(VarnodeTpl *newout)

{				// Force the output of the expression to be new out
				// If the original output is named, this requires
				// an extra COPY op
  OpTpl *op;
  if (outvn == (VarnodeTpl *)0)
    throw SleighError("Expression has no output");
  if (outvn->isUnnamed()) {
    delete outvn;
    op = ops->back();
    op->clearOutput();
    op->setOutput(newout);
  }
  else {
    op = new OpTpl(CPUI_COPY);
    op->addInput(outvn);
    op->setOutput(newout);
    ops->push_back(op);
  }
  outvn = new VarnodeTpl(*newout);
}